

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::writeQPDF(QPDFJob *this,QPDF *pdf)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  element_type *peVar4;
  Pipeline *pPVar5;
  size_t i;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_40;
  
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar4->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) || (peVar4->replace_input == true)) {
    QPDF::getLogger(pdf);
    bVar3 = Pl_Flate::zopfli_check_env
                      ((QPDFLogger *)
                       local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar3) {
      peVar4->warnings = true;
    }
  }
  if (((peVar4->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) && (peVar4->replace_input == false)) {
    doInspection(this,pdf);
  }
  else if (peVar4->split_pages == 0) {
    writeOutfile(this,pdf);
  }
  else {
    doSplitPages(this,pdf);
  }
  QPDF::getWarnings(&local_40,pdf);
  pQVar2 = local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pQVar1 = local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_40);
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pQVar1 == pQVar2) {
    if ((peVar4->warnings & 1U) == 0) goto LAB_00179079;
  }
  else {
    peVar4->warnings = true;
  }
  if (peVar4->suppress_warnings == false) {
    if (((peVar4->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) && (peVar4->replace_input != true)) {
      QPDFLogger::getWarn((QPDFLogger *)&local_40,
                          SUB81((peVar4->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          &((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      Pipeline::operator<<(pPVar5,": operation succeeded with warnings\n");
    }
    else {
      QPDFLogger::getWarn((QPDFLogger *)&local_40,
                          SUB81((peVar4->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          &((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      Pipeline::operator<<
                (pPVar5,
                 ": operation succeeded with warnings; resulting file may have some problems\n");
    }
    if (local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
LAB_00179079:
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      report_mem_usage == true) {
    i = QUtil::get_max_memory_usage();
    QPDFLogger::getWarn((QPDFLogger *)&local_40,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar5 = Pipeline::operator<<
                       ((Pipeline *)
                        local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                        super__Vector_impl_data._M_start,"qpdf-max-memory-usage ");
    pPVar5 = Pipeline::operator<<(pPVar5,i);
    Pipeline::operator<<(pPVar5,"\n");
    if (local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void
QPDFJob::writeQPDF(QPDF& pdf)
{
    if (createsOutput()) {
        if (!Pl_Flate::zopfli_check_env(pdf.getLogger().get())) {
            m->warnings = true;
        }
    }
    if (!createsOutput()) {
        doInspection(pdf);
    } else if (m->split_pages) {
        doSplitPages(pdf);
    } else {
        writeOutfile(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
    if (m->warnings && (!m->suppress_warnings)) {
        if (createsOutput()) {
            *m->log->getWarn()
                << m->message_prefix
                << ": operation succeeded with warnings; resulting file may have some problems\n";
        } else {
            *m->log->getWarn() << m->message_prefix << ": operation succeeded with warnings\n";
        }
    }
    if (m->report_mem_usage) {
        // Call get_max_memory_usage before generating output. When debugging, it's easier if print
        // statements from get_max_memory_usage are not interleaved with the output.
        auto mem_usage = QUtil::get_max_memory_usage();
        *m->log->getWarn() << "qpdf-max-memory-usage " << mem_usage << "\n";
    }
}